

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O3

reentrant_put_transaction<void> *
density_tests::detail::
PutTestObject<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>,_2048UL,_2048UL>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *i_queue,EasyRandom *param_2)

{
  reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *this;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *pcVar1;
  undefined8 uVar2;
  uintptr_t uVar3;
  ulong uVar4;
  reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> transaction;
  
  uVar4 = (ulong)&stack0xffffffffffffffd8 & 0xfffffffffffff800;
  *(undefined8 *)(uVar4 - 0x1808) = 0xc9f875;
  TestObject<2048UL,_2048UL>::TestObject((TestObject<2048UL,_2048UL> *)(uVar4 - 0x1000));
  *(undefined8 *)(uVar4 - 0x1808) = 0xc9f888;
  density::
  lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
  ::
  start_reentrant_emplace<density_tests::TestObject<2048ul,2048ul>,density_tests::TestObject<2048ul,2048ul>>
            ((reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)
             (uVar4 - 0x1040),
             (lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)0>
              *)i_queue,(TestObject<2048UL,_2048UL> *)(uVar4 - 0x1000));
  this = (reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)(uVar4 - 0x1020);
  *(undefined8 *)(uVar4 - 0x1010) = *(undefined8 *)(uVar4 - 0x1030);
  uVar2 = *(undefined8 *)(uVar4 - 0x1038);
  (this->m_put).m_control_block =
       (((reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)(uVar4 - 0x1040))
       ->m_put).m_control_block;
  *(undefined8 *)(uVar4 - 0x1018) = uVar2;
  pcVar1 = *(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
             **)(uVar4 - 0x1028);
  *(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
    **)(uVar4 - 0x1008) = pcVar1;
  *(undefined8 *)(uVar4 - 0x1030) = 0;
  *(undefined8 *)(uVar4 - 0x1808) = 0xc9f8bb;
  density::
  lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_>::
  ~reentrant_put_transaction
            ((reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)
             (uVar4 - 0x1040));
  uVar2 = *(undefined8 *)(uVar4 - 0x1018);
  *(LfQueueControl **)(uVar4 - 0x1060) = (this->m_put).m_control_block;
  *(undefined8 *)(uVar4 - 0x1058) = uVar2;
  *(undefined8 *)(uVar4 - 0x1050) = *(undefined8 *)(uVar4 - 0x1010);
  *(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
    **)(uVar4 - 0x1048) = pcVar1;
  *(undefined8 *)(uVar4 - 0x1010) = 0;
  *(undefined8 *)(uVar4 - 0x1808) = 0xc9f8e7;
  density::
  lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_>::
  ~reentrant_put_transaction(this);
  *(undefined8 *)(uVar4 - 0x1808) = 0xc9f8f4;
  TestObject<2048UL,_2048UL>::~TestObject((TestObject<2048UL,_2048UL> *)(uVar4 - 0x1000));
  *(undefined8 *)(uVar4 - 0x1808) = 0xc9f8f9;
  exception_checkpoint();
  (__return_storage_ptr__->m_put).m_user_storage = *(void **)(uVar4 - 0x1050);
  uVar3 = *(uintptr_t *)(uVar4 - 0x1058);
  (__return_storage_ptr__->m_put).m_control_block =
       (((reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)(uVar4 - 0x1060))
       ->m_put).m_control_block;
  (__return_storage_ptr__->m_put).m_next_ptr = uVar3;
  __return_storage_ptr__->m_queue = pcVar1;
  *(undefined8 *)(uVar4 - 0x1050) = 0;
  *(undefined8 *)(uVar4 - 0x1808) = 0xc9f920;
  density::
  lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_>::
  ~reentrant_put_transaction
            ((reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)
             (uVar4 - 0x1060));
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                auto transaction = i_queue.start_reentrant_push(ElementType());
                exception_checkpoint();
                return std::move(transaction);
            }